

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O3

Inmate * createInmate(InmateType type)

{
  Inmate *pIVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pIVar1 = (Inmate *)malloc(0x1c);
  pIVar1->type = (char)type;
  pIVar1->position = -1.0;
  switch(type) {
  case ATTORNEY:
    uVar2 = 0x1e;
    uVar3 = 0x1e;
    uVar4 = 4;
    uVar5 = 0x1e;
    goto LAB_001043c8;
  case BRUISER:
    pIVar1->currentHealth = 0x10;
    pIVar1->maxHealth = 0x10;
    pIVar1->speed = 4;
    pIVar1->rep = 0xf;
    pIVar1->panic = 6;
    break;
  case CUTIE:
    pIVar1->currentHealth = 0x14;
    pIVar1->maxHealth = 0x14;
    pIVar1->speed = 4;
    pIVar1->rep = 0x14;
    pIVar1->panic = 1;
    break;
  case DOCTOR:
    uVar2 = 10;
    uVar3 = 10;
    uVar4 = 4;
    uVar5 = 0x28;
    goto LAB_001043c8;
  case 0x65:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
switchD_00104327_caseD_65:
    quit("Creating unsupported unit type.");
    return pIVar1;
  case FATTY:
    pIVar1->currentHealth = 0x28;
    pIVar1->maxHealth = 0x28;
    pIVar1->speed = 2;
    pIVar1->rep = 10;
    pIVar1->panic = 4;
    break;
  case HOMEBOY:
    uVar2 = 10;
    uVar3 = 10;
    uVar4 = 4;
    uVar5 = 5;
    goto LAB_001043c8;
  case LUNATIC:
    pIVar1->currentHealth = 0x10;
    pIVar1->maxHealth = 0x10;
    pIVar1->speed = 6;
    pIVar1->rep = 10;
    pIVar1->panic = 8;
    break;
  case SPEEDY:
    uVar2 = 10;
    uVar3 = 10;
    uVar4 = 8;
    uVar5 = 0x14;
LAB_001043c8:
    pIVar1->currentHealth = uVar2;
    pIVar1->maxHealth = uVar3;
    pIVar1->speed = uVar4;
    pIVar1->rep = uVar5;
    pIVar1->panic = 2;
    break;
  default:
    if (type != PROTAGONIST) goto switchD_00104327_caseD_65;
    pIVar1->currentHealth = 5;
    pIVar1->maxHealth = 5;
    pIVar1->speed = 2;
    pIVar1->rep = 0;
    pIVar1->panic = 0;
  }
  pIVar1->delUnit = false;
  return pIVar1;
}

Assistant:

struct Inmate *createInmate(enum InmateType type) {

    struct Inmate *unit = malloc(sizeof(struct Inmate));

    unit->type = type;
    unit->position = -1;

    switch (type) {

        case PROTAGONIST:
            unit->currentHealth = unit->maxHealth = 5;
            unit->speed = 2;
            unit->rep = 0;
            unit->panic = 0;
            unit->delUnit = FALSE;
            break;

        case HOMEBOY:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 4;
            unit->rep = 5;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case BRUISER:
            unit->currentHealth = unit->maxHealth = 16;
            unit->speed = 4;
            unit->rep = 15;
            unit->panic = 6;
            unit->delUnit = FALSE;
            break;

        case LUNATIC:
            unit->currentHealth = unit->maxHealth = 16;
            unit->speed = 6;
            unit->rep = 10;
            unit->panic = 8;
            unit->delUnit = FALSE;
            break;

        case FATTY:
            unit->currentHealth = unit->maxHealth = 40;
            unit->speed = 2;
            unit->rep = 10;
            unit->panic = 4;
            unit->delUnit = FALSE;
            break;

        case SPEEDY:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 8;
            unit->rep = 20;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case CUTIE:
            unit->currentHealth = unit->maxHealth = 20;
            unit->speed = 4;
            unit->rep = 20;
            unit->panic = 1;
            unit->delUnit = FALSE;
            break;

        case ATTORNEY:
            unit->currentHealth = unit->maxHealth = 30;
            unit->speed = 4;
            unit->rep = 30;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        case DOCTOR:
            unit->currentHealth = unit->maxHealth = 10;
            unit->speed = 4;
            unit->rep = 40;
            unit->panic = 2;
            unit->delUnit = FALSE;
            break;

        default:
            quit("Creating unsupported unit type.");
            break;
    }

    return unit;
}